

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O0

PaError PaSkeleton_Initialize(PaUtilHostApiRepresentation **hostApi,PaHostApiIndex hostApiIndex)

{
  void *pvVar1;
  PaUtilAllocationGroup *pPVar2;
  long *in_RDI;
  PaDeviceInfo *deviceInfo;
  PaDeviceInfo *deviceInfoArray;
  PaSkeletonHostApiRepresentation *skeletonHostApi;
  int deviceCount;
  int i;
  PaError result;
  PaUtilAllocationGroup *in_stack_ffffffffffffff70;
  
  pvVar1 = PaUtil_AllocateMemory((long)in_stack_ffffffffffffff70);
  if (pvVar1 != (void *)0x0) {
    pPVar2 = PaUtil_CreateAllocationGroup();
    *(PaUtilAllocationGroup **)((long)pvVar1 + 0x108) = pPVar2;
    if (*(long *)((long)pvVar1 + 0x108) != 0) {
      *in_RDI = (long)pvVar1;
      *(undefined4 *)(*in_RDI + 8) = 1;
      *(undefined4 *)(*in_RDI + 0xc) = 0;
      *(char **)(*in_RDI + 0x10) = "skeleton implementation";
      *(undefined4 *)(*in_RDI + 0x1c) = 0xffffffff;
      *(undefined4 *)(*in_RDI + 0x20) = 0xffffffff;
      *(undefined4 *)(*in_RDI + 0x18) = 0;
      *(code **)(*in_RDI + 0x30) = Terminate;
      *(code **)(*in_RDI + 0x38) = OpenStream;
      *(code **)(*in_RDI + 0x40) = IsFormatSupported;
      PaUtil_InitializeStreamInterface
                ((PaUtilStreamInterface *)((long)pvVar1 + 0x48),CloseStream,StartStream,StopStream,
                 AbortStream,IsStreamStopped,IsStreamActive,GetStreamTime,GetStreamCpuLoad,
                 PaUtil_DummyRead,PaUtil_DummyWrite,PaUtil_DummyGetReadAvailable,
                 PaUtil_DummyGetWriteAvailable);
      PaUtil_InitializeStreamInterface
                ((PaUtilStreamInterface *)((long)pvVar1 + 0xa8),CloseStream,StartStream,StopStream,
                 AbortStream,IsStreamStopped,IsStreamActive,GetStreamTime,PaUtil_DummyGetCpuLoad,
                 ReadStream,WriteStream,GetStreamReadAvailable,GetStreamWriteAvailable);
      return 0;
    }
  }
  if (pvVar1 != (void *)0x0) {
    if (*(long *)((long)pvVar1 + 0x108) != 0) {
      PaUtil_FreeAllAllocations(in_stack_ffffffffffffff70);
      PaUtil_DestroyAllocationGroup(in_stack_ffffffffffffff70);
    }
    PaUtil_FreeMemory((void *)0x111dae);
  }
  return -0x2708;
}

Assistant:

PaError PaSkeleton_Initialize( PaUtilHostApiRepresentation **hostApi, PaHostApiIndex hostApiIndex )
{
    PaError result = paNoError;
    int i, deviceCount;
    PaSkeletonHostApiRepresentation *skeletonHostApi;
    PaDeviceInfo *deviceInfoArray;

    skeletonHostApi = (PaSkeletonHostApiRepresentation*)PaUtil_AllocateMemory( sizeof(PaSkeletonHostApiRepresentation) );
    if( !skeletonHostApi )
    {
        result = paInsufficientMemory;
        goto error;
    }

    skeletonHostApi->allocations = PaUtil_CreateAllocationGroup();
    if( !skeletonHostApi->allocations )
    {
        result = paInsufficientMemory;
        goto error;
    }

    *hostApi = &skeletonHostApi->inheritedHostApiRep;
    (*hostApi)->info.structVersion = 1;
    (*hostApi)->info.type = paInDevelopment;            /* IMPLEMENT ME: change to correct type id */
    (*hostApi)->info.name = "skeleton implementation";  /* IMPLEMENT ME: change to correct name */

    (*hostApi)->info.defaultInputDevice = paNoDevice;  /* IMPLEMENT ME */
    (*hostApi)->info.defaultOutputDevice = paNoDevice; /* IMPLEMENT ME */

    (*hostApi)->info.deviceCount = 0;  

    deviceCount = 0; /* IMPLEMENT ME */
    
    if( deviceCount > 0 )
    {
        (*hostApi)->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory(
                skeletonHostApi->allocations, sizeof(PaDeviceInfo*) * deviceCount );
        if( !(*hostApi)->deviceInfos )
        {
            result = paInsufficientMemory;
            goto error;
        }

        /* allocate all device info structs in a contiguous block */
        deviceInfoArray = (PaDeviceInfo*)PaUtil_GroupAllocateMemory(
                skeletonHostApi->allocations, sizeof(PaDeviceInfo) * deviceCount );
        if( !deviceInfoArray )
        {
            result = paInsufficientMemory;
            goto error;
        }

        for( i=0; i < deviceCount; ++i )
        {
            PaDeviceInfo *deviceInfo = &deviceInfoArray[i];
            deviceInfo->structVersion = 2;
            deviceInfo->hostApi = hostApiIndex;
            deviceInfo->name = 0; /* IMPLEMENT ME: allocate block and copy name eg:
                deviceName = (char*)PaUtil_GroupAllocateMemory( skeletonHostApi->allocations, strlen(srcName) + 1 );
                if( !deviceName )
                {
                    result = paInsufficientMemory;
                    goto error;
                }
                strcpy( deviceName, srcName );
                deviceInfo->name = deviceName;
            */

            deviceInfo->maxInputChannels = 0;  /* IMPLEMENT ME */
            deviceInfo->maxOutputChannels = 0;  /* IMPLEMENT ME */
            
            deviceInfo->defaultLowInputLatency = 0.;  /* IMPLEMENT ME */
            deviceInfo->defaultLowOutputLatency = 0.;  /* IMPLEMENT ME */
            deviceInfo->defaultHighInputLatency = 0.;  /* IMPLEMENT ME */
            deviceInfo->defaultHighOutputLatency = 0.;  /* IMPLEMENT ME */  

            deviceInfo->defaultSampleRate = 0.; /* IMPLEMENT ME */
            
            (*hostApi)->deviceInfos[i] = deviceInfo;
            ++(*hostApi)->info.deviceCount;
        }
    }

    (*hostApi)->Terminate = Terminate;
    (*hostApi)->OpenStream = OpenStream;
    (*hostApi)->IsFormatSupported = IsFormatSupported;

    PaUtil_InitializeStreamInterface( &skeletonHostApi->callbackStreamInterface, CloseStream, StartStream,
                                      StopStream, AbortStream, IsStreamStopped, IsStreamActive,
                                      GetStreamTime, GetStreamCpuLoad,
                                      PaUtil_DummyRead, PaUtil_DummyWrite,
                                      PaUtil_DummyGetReadAvailable, PaUtil_DummyGetWriteAvailable );

    PaUtil_InitializeStreamInterface( &skeletonHostApi->blockingStreamInterface, CloseStream, StartStream,
                                      StopStream, AbortStream, IsStreamStopped, IsStreamActive,
                                      GetStreamTime, PaUtil_DummyGetCpuLoad,
                                      ReadStream, WriteStream, GetStreamReadAvailable, GetStreamWriteAvailable );

    return result;

error:
    if( skeletonHostApi )
    {
        if( skeletonHostApi->allocations )
        {
            PaUtil_FreeAllAllocations( skeletonHostApi->allocations );
            PaUtil_DestroyAllocationGroup( skeletonHostApi->allocations );
        }
                
        PaUtil_FreeMemory( skeletonHostApi );
    }
    return result;
}